

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_automaticIdsAlreadyExisting_Test::TestBody
          (Annotator_automaticIdsAlreadyExisting_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_3f8 [2];
  AssertHelper local_3d8 [8];
  Message local_3d0 [15];
  bool local_3c1;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_390 [8];
  Message local_388 [15];
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_348 [8];
  Message local_340 [15];
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_300 [8];
  Message local_2f8 [15];
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2b8 [8];
  Message local_2b0 [15];
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_270 [8];
  Message local_268 [15];
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_228 [8];
  Message local_220 [15];
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1e0 [8];
  Message local_1d8 [15];
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_198 [8];
  Message local_190 [15];
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_150 [8];
  Message local_148 [15];
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108 [8];
  Message local_100 [15];
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c0 [8];
  Message local_b8 [15];
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_78 [8];
  Message local_70 [15];
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  AnnotatorPtr annotator;
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Annotator_automaticIdsAlreadyExisting_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)local_30);
  libcellml::Annotator::create();
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  libcellml::Annotator::setModel((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_61 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar2) {
    testing::Message::Message(local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_60,
               "annotator->assignIds(libcellml::CellmlElementType::COMPONENT)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x407,pcVar4);
    testing::internal::AssertHelper::operator=(local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_a8,
               "annotator->assignIds(libcellml::CellmlElementType::COMPONENT_REF)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x408,pcVar4);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__3.message_,local_f0,
               "annotator->assignIds(libcellml::CellmlElementType::CONNECTION)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x409,pcVar4);
    testing::internal::AssertHelper::operator=(local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_139 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar2) {
    testing::Message::Message(local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__4.message_,local_138,
               "annotator->assignIds(libcellml::CellmlElementType::ENCAPSULATION)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x40a,pcVar4);
    testing::internal::AssertHelper::operator=(local_150,local_148);
    testing::internal::AssertHelper::~AssertHelper(local_150);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_181 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar2) {
    testing::Message::Message(local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__5.message_,local_180,
               "annotator->assignIds(libcellml::CellmlElementType::IMPORT)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x40b,pcVar4);
    testing::internal::AssertHelper::operator=(local_198,local_190);
    testing::internal::AssertHelper::~AssertHelper(local_198);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_1c9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar2) {
    testing::Message::Message(local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__6.message_,local_1c8,
               "annotator->assignIds(libcellml::CellmlElementType::MAP_VARIABLES)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x40c,pcVar4);
    testing::internal::AssertHelper::operator=(local_1e0,local_1d8);
    testing::internal::AssertHelper::~AssertHelper(local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_211 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_210,&local_211,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar2) {
    testing::Message::Message(local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__7.message_,local_210,
               "annotator->assignIds(libcellml::CellmlElementType::MODEL)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x40d,pcVar4);
    testing::internal::AssertHelper::operator=(local_228,local_220);
    testing::internal::AssertHelper::~AssertHelper(local_228);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_259 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_258,&local_259,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar2) {
    testing::Message::Message(local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__8.message_,local_258,
               "annotator->assignIds(libcellml::CellmlElementType::RESET)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x40e,pcVar4);
    testing::internal::AssertHelper::operator=(local_270,local_268);
    testing::internal::AssertHelper::~AssertHelper(local_270);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_2a1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar2) {
    testing::Message::Message(local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__9.message_,local_2a0,
               "annotator->assignIds(libcellml::CellmlElementType::RESET_VALUE)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x40f,pcVar4);
    testing::internal::AssertHelper::operator=(local_2b8,local_2b0);
    testing::internal::AssertHelper::~AssertHelper(local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_2e9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar2) {
    testing::Message::Message(local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__10.message_,local_2e8,
               "annotator->assignIds(libcellml::CellmlElementType::TEST_VALUE)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x410,pcVar4);
    testing::internal::AssertHelper::operator=(local_300,local_2f8);
    testing::internal::AssertHelper::~AssertHelper(local_300);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_331 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar2) {
    testing::Message::Message(local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__11.message_,local_330,
               "annotator->assignIds(libcellml::CellmlElementType::UNIT)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x411,pcVar4);
    testing::internal::AssertHelper::operator=(local_348,local_340);
    testing::internal::AssertHelper::~AssertHelper(local_348);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_379 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_378,&local_379,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar2) {
    testing::Message::Message(local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__12.message_,local_378,
               "annotator->assignIds(libcellml::CellmlElementType::UNITS)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x412,pcVar4);
    testing::internal::AssertHelper::operator=(local_390,local_388);
    testing::internal::AssertHelper::~AssertHelper(local_390);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)peVar3);
  local_3c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c0,&local_3c1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar2) {
    testing::Message::Message(local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_3f8,local_3c0,"annotator->assignIds(libcellml::CellmlElementType::VARIABLE)",
               "true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x413,pcVar4);
    testing::internal::AssertHelper::operator=(local_3d8,local_3d0);
    testing::internal::AssertHelper::~AssertHelper(local_3d8);
    std::__cxx11::string::~string((string *)local_3f8);
    testing::Message::~Message(local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, automaticIdsAlreadyExisting)
{
    // Adding test for coverage purposes.
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringUniqueIds);
    auto annotator = libcellml::Annotator::create();

    annotator->setModel(model);

    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::COMPONENT));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::COMPONENT_REF));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::CONNECTION));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::ENCAPSULATION));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::IMPORT));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::MAP_VARIABLES));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::MODEL));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::RESET));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::RESET_VALUE));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::TEST_VALUE));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::UNIT));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::UNITS));
    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::VARIABLE));
}